

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

uint32_t float128_to_uint32_ppc64(float128 a,float_status *status)

{
  byte bVar1;
  uint64_t uVar2;
  
  bVar1 = status->float_exception_flags;
  uVar2 = float128_to_uint64_ppc64(a,status);
  if (uVar2 >> 0x20 != 0) {
    status->float_exception_flags = bVar1 | 1;
    uVar2 = 0xffffffff;
  }
  return (uint32_t)uVar2;
}

Assistant:

uint32_t float128_to_uint32(float128 a, float_status *status)
{
    uint64_t v;
    uint32_t res;
    int old_exc_flags = get_float_exception_flags(status);

    v = float128_to_uint64(a, status);
    if (v > 0xffffffff) {
        res = 0xffffffff;
    } else {
        return v;
    }
    set_float_exception_flags(old_exc_flags, status);
    float_raise(float_flag_invalid, status);
    return res;
}